

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void nes_system_reset(nes_system *system)

{
  int iVar1;
  cpu_state cVar2;
  uint local_2c;
  undefined2 uStack_28;
  undefined2 uStack_26;
  uint32_t i;
  undefined8 local_20;
  nes_system_state *state;
  nes_system *system_local;
  
  nes_ppu_reset(&(system->state).ppu);
  nes_apu_reset(&(system->state).apu);
  cVar2 = cpu_reset();
  _uStack_28 = cVar2._0_8_;
  (system->state).cpu.cycle = uStack_28;
  (system->state).cpu.PC = uStack_26;
  (system->state).cpu.S = (undefined1)i;
  (system->state).cpu.P = i._1_1_;
  (system->state).cpu.address = i._2_2_;
  local_20 = cVar2._8_8_;
  (system->state).cpu.rw_mode = (undefined1)local_20;
  (system->state).cpu.field_0x9 = local_20._1_1_;
  (system->state).cpu.data = local_20._2_1_;
  (system->state).cpu.temp = local_20._3_1_;
  (system->state).cpu.A = local_20._4_1_;
  (system->state).cpu.X = local_20._5_1_;
  (system->state).cpu.Y = local_20._6_1_;
  (system->state).cpu.field_0xf = local_20._7_1_;
  (system->state).cpu_odd_cycle = 1;
  (system->state).dmc_dma = 0;
  (system->state).oam_dma = 0;
  (system->state).oam_dma_data = '\0';
  (system->state).oam_dma_cycle = 0;
  (system->state).oam_dma_src_address = 0;
  (system->state).oam_dma_dst_address = '\0';
  (system->state).controller_input0 = '\0';
  (system->state).controller_input1 = '\x01';
  for (local_2c = 0; local_2c < 0x800; local_2c = local_2c + 1) {
    iVar1 = rand();
    (system->state).ram[local_2c] = (uint8_t)iVar1;
  }
  return;
}

Assistant:

void nes_system_reset(nes_system* system)
{
    nes_system_state* state = &system->state;

    nes_ppu_reset(&state->ppu);
    nes_apu_reset(&state->apu);
    state->cpu = cpu_reset();
    state->cpu_odd_cycle = 1;
    state->dmc_dma = 0;
    state->oam_dma = 0;
    state->oam_dma_data = 0;
    state->oam_dma_cycle = 0;
    state->oam_dma_src_address = 0;
    state->oam_dma_dst_address = 0;
    state->controller_input0 = 0;
    state->controller_input1 = 1;

    for (uint32_t i = 0; i < 0x800; ++i)
        state->ram[i] = (uint8_t)rand();
}